

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O2

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,Wavelength *wavelength)

{
  allocator<char> local_51;
  string local_50;
  function<BSDFData::WavelengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"unit",&local_51);
  local_30.super__Function_base._M_functor._8_8_ = 0;
  local_30.super__Function_base._M_functor._M_unused._M_object = WavelengthUnitFromString;
  local_30._M_invoker =
       std::
       _Function_handler<BSDFData::WavelengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::WavelengthUnit_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
       ::_M_invoke;
  local_30.super__Function_base._M_manager =
       std::
       _Function_handler<BSDFData::WavelengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::WavelengthUnit_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
       ::_M_manager;
  FileParse::loadAttribute<XMLNodeAdapter,_BSDFData::WavelengthUnit,_0>
            (node,&local_50,&wavelength->unit,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"type",(allocator<char> *)&local_30);
  FileParse::loadAttribute<XMLNodeAdapter>(node,&local_50,&wavelength->type);
  std::__cxx11::string::~string((string *)&local_50);
  FileParse::operator>>(node,&wavelength->value);
  return node;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node, BSDFData::Wavelength & wavelength)
    {
        using FileParse::operator>>;   // operators for basic C++ types are in the FileParse
                                       // namespace

        FileParse::loadAttribute<NodeAdapter, BSDFData::WavelengthUnit>(
          node, "unit", wavelength.unit, WavelengthUnitFromString);
        FileParse::loadAttribute(node, "type", wavelength.type);
        node >> wavelength.value;

        return node;
    }